

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O0

void __thiscall dlib::timer<dlib::image_display>::clear(timer<dlib::image_display> *this)

{
  element_type *this_00;
  char *in_RDI;
  auto_mutex *this_01;
  auto_mutex M;
  mutex *in_stack_ffffffffffffffb8;
  
  this_01 = (auto_mutex *)(in_RDI + 0xb0);
  std::__shared_ptr_access<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x48ee54);
  auto_mutex::auto_mutex(this_01,in_stack_ffffffffffffffb8);
  in_RDI[0x91] = '\0';
  this_00 = std::
            __shared_ptr_access<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<dlib::timer_global_clock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x48ee7b);
  timer_global_clock::remove(this_00,in_RDI);
  in_RDI[0x80] = -0x18;
  in_RDI[0x81] = '\x03';
  in_RDI[0x82] = '\0';
  in_RDI[0x83] = '\0';
  in_RDI[0x84] = '\0';
  in_RDI[0x85] = '\0';
  in_RDI[0x86] = '\0';
  in_RDI[0x87] = '\0';
  in_RDI[0x88] = '\0';
  in_RDI[0x89] = '\0';
  in_RDI[0x8a] = '\0';
  in_RDI[0x8b] = '\0';
  in_RDI[0x8c] = '\0';
  in_RDI[0x8d] = '\0';
  in_RDI[0x8e] = '\0';
  in_RDI[0x8f] = '\0';
  auto_mutex::~auto_mutex((auto_mutex *)0x48eeaf);
  return;
}

Assistant:

void timer<T>::
    clear(
    )
    {
        auto_mutex M(gc->m);
        running = false;
        gc->remove(this);
        delay = 1000;        
        next_time_to_run = 0;
    }